

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall
slang::ast::Compilation::resolveBindTargets
          (Compilation *this,BindDirectiveSyntax *syntax,Scope *scope,ResolvedBind *resolvedBind)

{
  SourceRange range;
  bitmask<slang::ast::ASTFlags> flags_00;
  LookupLocation lookupLocation;
  string_view arg;
  string_view arg_00;
  string_view name_00;
  string_view name_01;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar1;
  NameSyntax *pNVar2;
  SyntaxNode *pSVar3;
  DefinitionSymbol *pDVar4;
  Scope *scope_00;
  MemberSyntax *pMVar5;
  InstanceBodySymbol *pIVar6;
  long in_RCX;
  long in_RSI;
  SourceRange SVar7;
  InstanceBodySymbol *inst_1;
  HierarchyInstantiationSyntax *his;
  Symbol *def;
  Token name_1;
  LookupResult result_1;
  Diagnostic *diag;
  LookupResult result;
  NameSyntax *inst;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range3;
  Symbol *targetDef;
  Token name;
  bitmask<slang::ast::LookupFlags> flags;
  ASTContext context;
  anon_class_8_1_a89d2d74 checkValidTarget;
  SourceLocation in_stack_fffffffffffff858;
  SourceLocation in_stack_fffffffffffff860;
  SourceLocation in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff870;
  DiagCode in_stack_fffffffffffff874;
  Scope *in_stack_fffffffffffff878;
  Token *in_stack_fffffffffffff880;
  Diagnostic *in_stack_fffffffffffff8a0;
  SyntaxNode *in_stack_fffffffffffff8a8;
  Symbol *in_stack_fffffffffffff8b0;
  undefined7 in_stack_fffffffffffff8b8;
  undefined1 in_stack_fffffffffffff8bf;
  undefined8 in_stack_fffffffffffff8c0;
  DiagCode code;
  size_t in_stack_fffffffffffff8c8;
  char *in_stack_fffffffffffff8d0;
  SourceLocation in_stack_fffffffffffff8e0;
  SourceLocation in_stack_fffffffffffff8e8;
  undefined8 local_690;
  undefined8 local_688;
  undefined8 local_680;
  Scope *in_stack_fffffffffffff998;
  SourceLocation in_stack_fffffffffffff9a0;
  SourceLocation in_stack_fffffffffffff9a8;
  undefined8 in_stack_fffffffffffff9b0;
  int *local_648;
  long local_608;
  Scope *in_stack_fffffffffffffa88;
  Compilation *in_stack_fffffffffffffa90;
  string_view in_stack_fffffffffffffa98;
  LookupResult *in_stack_fffffffffffffc30;
  ASTContext *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  SourceLocation in_stack_fffffffffffffc48;
  bitmask<slang::ast::LookupFlags> flags_01;
  long local_350;
  SourceLocation local_d8;
  SourceLocation local_d0;
  DefinitionSymbol *local_b8;
  bitmask<slang::ast::LookupFlags> local_84;
  underlying_type local_80;
  underlying_type local_7c;
  bitmask<slang::ast::ASTFlags> local_78;
  undefined8 local_70;
  undefined8 local_68;
  long local_20;
  long local_10;
  
  code = SUB84((ulong)in_stack_fffffffffffff8c0 >> 0x20,0);
  local_70 = LookupLocation::max;
  local_68 = DAT_0101c840;
  local_20 = in_RCX;
  local_10 = in_RSI;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_78,None);
  lookupLocation._8_8_ = in_stack_fffffffffffff880;
  lookupLocation.scope = in_stack_fffffffffffff878;
  flags_00.m_bits._4_4_ = in_stack_fffffffffffff874;
  flags_00.m_bits._0_4_ = in_stack_fffffffffffff870;
  ASTContext::ASTContext
            ((ASTContext *)in_stack_fffffffffffff868,(Scope *)in_stack_fffffffffffff860,
             lookupLocation,flags_00);
  local_80 = (underlying_type)
             ast::operator|(in_stack_fffffffffffff860._0_4_,in_stack_fffffffffffff858._4_4_);
  bitmask<slang::ast::LookupFlags>::bitmask(&local_84,NoSelectors);
  local_7c = (underlying_type)
             bitmask<slang::ast::LookupFlags>::operator|
                       ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffff868,
                        (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffff860);
  flags_01.m_bits = in_stack_fffffffffffffc48._4_4_;
  if (*(long *)(local_10 + 0x68) != 0) {
    pNVar2 = not_null<slang::syntax::NameSyntax_*>::operator->
                       ((not_null<slang::syntax::NameSyntax_*> *)0x8be0ba);
    if ((pNVar2->super_ExpressionSyntax).super_SyntaxNode.kind != IdentifierName) {
      return;
    }
    pSVar3 = (SyntaxNode *)
             not_null<slang::syntax::NameSyntax_*>::operator->
                       ((not_null<slang::syntax::NameSyntax_*> *)0x8be0d8);
    slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(pSVar3);
    parsing::Token::valueText
              ((Token *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
    SVar7 = parsing::Token::range(in_stack_fffffffffffff880);
    local_d8 = SVar7.startLoc;
    local_d0 = SVar7.endLoc;
    name_00._M_str = in_stack_fffffffffffff8d0;
    name_00._M_len = in_stack_fffffffffffff8c8;
    sourceRange.endLoc = in_stack_fffffffffffff8e8;
    sourceRange.startLoc = in_stack_fffffffffffff8e0;
    getDefinition((Compilation *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8),
                  name_00,(Scope *)in_stack_fffffffffffff8b0,sourceRange,code);
    if (local_b8 == (DefinitionSymbol *)0x0) {
      return;
    }
    slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::begin
              ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0x8be1e1);
    slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::end
              ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)local_d0);
    while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>_>
                             ((self_type *)local_d0,
                              (iterator_base<slang::syntax::NameSyntax_*> *)local_d8),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
      ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
                   *)0x8be23b);
      LookupResult::LookupResult((LookupResult *)local_d0);
      Lookup::name((NameSyntax *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   in_stack_fffffffffffffc38,
                   (bitmask<slang::ast::LookupFlags>)in_stack_fffffffffffffc48._4_4_,
                   in_stack_fffffffffffffc30);
      LookupResult::reportDiags((LookupResult *)local_d0,(ASTContext *)local_d8);
      if ((local_350 != 0) &&
         (bVar1 = resolveBindTargets::anon_class_8_1_a89d2d74::operator()
                            ((anon_class_8_1_a89d2d74 *)
                             CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8),
                             in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8), bVar1)) {
        Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x8be2f5);
        pDVar4 = InstanceSymbol::getDefinition((InstanceSymbol *)0x8be30c);
        if (pDVar4 != local_b8) {
          slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff8b0);
          sourceRange_01.endLoc = in_stack_fffffffffffff9a8;
          sourceRange_01.startLoc = in_stack_fffffffffffff9a0;
          Scope::addDiag(in_stack_fffffffffffff998,SUB84((ulong)in_stack_fffffffffffff9b0 >> 0x20,0)
                         ,sourceRange_01);
          arg._M_str = (char *)in_stack_fffffffffffff8b0;
          arg._M_len = (size_t)in_stack_fffffffffffff8a8;
          Diagnostic::operator<<(in_stack_fffffffffffff8a0,arg);
          arg_00._M_str = (char *)in_stack_fffffffffffff8b0;
          arg_00._M_len = (size_t)in_stack_fffffffffffff8a8;
          Diagnostic::operator<<(in_stack_fffffffffffff8a0,arg_00);
          not_null<slang::syntax::NameSyntax_*>::operator->
                    ((not_null<slang::syntax::NameSyntax_*> *)0x8be453);
          SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff8b0);
          in_stack_fffffffffffffc48 = SVar7.startLoc;
          range.endLoc._0_4_ = in_stack_fffffffffffff870;
          range.startLoc = in_stack_fffffffffffff868;
          range.endLoc._4_2_ = in_stack_fffffffffffff874.subsystem;
          range.endLoc._6_2_ = in_stack_fffffffffffff874.code;
          Diagnostic::operator<<((Diagnostic *)local_d0,range);
          in_stack_fffffffffffffc44 = 0x50001;
          in_stack_fffffffffffffc38 = *(ASTContext **)(local_350 + 0x18);
          Diagnostic::addNote((Diagnostic *)local_d0,in_stack_fffffffffffff874,
                              in_stack_fffffffffffff868);
        }
        SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Symbol_*> *)local_d0,(Symbol **)local_d8);
      }
      LookupResult::~LookupResult((LookupResult *)local_d0);
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
                  *)local_d0);
    }
    goto LAB_008be829;
  }
  LookupResult::LookupResult((LookupResult *)in_stack_fffffffffffff860);
  pNVar2 = not_null<slang::syntax::NameSyntax_*>::operator*
                     ((not_null<slang::syntax::NameSyntax_*> *)0x8be57d);
  Lookup::name((NameSyntax *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               in_stack_fffffffffffffc38,flags_01,in_stack_fffffffffffffc30);
  if (local_608 == 0) {
    scope_00 = (Scope *)not_null<slang::syntax::NameSyntax_*>::operator->
                                  ((not_null<slang::syntax::NameSyntax_*> *)0x8be665);
    SVar7.endLoc = in_stack_fffffffffffff860;
    SVar7.startLoc = in_stack_fffffffffffff858;
    if ((((ExpressionSyntax *)&scope_00->compilation)->super_SyntaxNode).kind != IdentifierName)
    goto LAB_008be7d5;
    pSVar3 = (SyntaxNode *)
             not_null<slang::syntax::NameSyntax_*>::operator->
                       ((not_null<slang::syntax::NameSyntax_*> *)0x8be68e);
    slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(pSVar3);
    parsing::Token::valueText
              ((Token *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
    SVar7 = parsing::Token::range(in_stack_fffffffffffff880);
    name_01._M_str = (char *)pNVar2;
    name_01._M_len = in_stack_fffffffffffff8c8;
    sourceRange_00.endLoc = in_stack_fffffffffffff8e8;
    sourceRange_00.startLoc = in_stack_fffffffffffff8e0;
    getDefinition((Compilation *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8),
                  name_01,scope_00,sourceRange_00,code);
    if (local_648 != (int *)0x0) {
      if (*local_648 == 2) {
        pDVar4 = Symbol::as<slang::ast::DefinitionSymbol>((Symbol *)0x8be7b9);
        in_stack_fffffffffffff870 = SUB84(pDVar4,0);
        in_stack_fffffffffffff874 = SUB84((ulong)pDVar4 >> 0x20,0);
        *(DefinitionSymbol **)(local_20 + 0x58) = pDVar4;
      }
      goto LAB_008be7d5;
    }
    bVar1 = true;
  }
  else {
    not_null<slang::syntax::NameSyntax_*>::operator*
              ((not_null<slang::syntax::NameSyntax_*> *)0x8be5e2);
    bVar1 = resolveBindTargets::anon_class_8_1_a89d2d74::operator()
                      ((anon_class_8_1_a89d2d74 *)
                       CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8),
                       in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    if (bVar1) {
      SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffff860,
                 (Symbol **)in_stack_fffffffffffff858);
    }
    SVar7.endLoc = in_stack_fffffffffffff860;
    SVar7.startLoc = in_stack_fffffffffffff858;
LAB_008be7d5:
    if (*(long *)(local_20 + 0x58) == 0) {
      LookupResult::reportDiags((LookupResult *)SVar7.endLoc,(ASTContext *)SVar7.startLoc);
    }
    bVar1 = false;
  }
  LookupResult::~LookupResult((LookupResult *)SVar7.endLoc);
  if (bVar1) {
    return;
  }
LAB_008be829:
  pMVar5 = not_null<slang::syntax::MemberSyntax_*>::operator->
                     ((not_null<slang::syntax::MemberSyntax_*> *)0x8be83a);
  if ((pMVar5->super_SyntaxNode).kind == HierarchyInstantiation) {
    pMVar5 = not_null<slang::syntax::MemberSyntax_*>::operator->
                       ((not_null<slang::syntax::MemberSyntax_*> *)0x8be857);
    slang::syntax::SyntaxNode::as<slang::syntax::HierarchyInstantiationSyntax>
              (&pMVar5->super_SyntaxNode);
    parsing::Token::valueText
              ((Token *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
    tryGetDefinition(in_stack_fffffffffffffa90,in_stack_fffffffffffffa98,in_stack_fffffffffffffa88);
    *(undefined8 *)(local_20 + 0x40) = local_690;
    *(undefined8 *)(local_20 + 0x48) = local_688;
    *(undefined8 *)(local_20 + 0x50) = local_680;
    if (((*(long *)(local_20 + 0x48) == 0) &&
        (pIVar6 = Scope::getContainingInstance((Scope *)in_stack_fffffffffffff868),
        pIVar6 != (InstanceBodySymbol *)0x0)) && (pIVar6->parentInstance != (InstanceSymbol *)0x0))
    {
      *(ResolvedConfig **)(local_20 + 0x60) = pIVar6->parentInstance->resolvedConfig;
    }
  }
  return;
}

Assistant:

void Compilation::resolveBindTargets(const BindDirectiveSyntax& syntax, const Scope& scope,
                                     ResolvedBind& resolvedBind) {
    auto checkValidTarget = [&](const Symbol& symbol, const SyntaxNode& nameSyntax) {
        if (symbol.kind == SymbolKind::Instance) {
            auto defKind = symbol.as<InstanceSymbol>().getDefinition().definitionKind;
            if (defKind == DefinitionKind::Module || defKind == DefinitionKind::Interface)
                return true;
        }

        auto& diag = scope.addDiag(diag::InvalidBindTarget, nameSyntax.sourceRange());
        diag << symbol.name;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        return false;
    };

    // If an instance list is given, then the target name must be a definition name.
    // Otherwise, the target name can be either an instance name or a definition name,
    // preferencing the instance if found.
    ASTContext context(scope, LookupLocation::max);
    bitmask<LookupFlags> flags = LookupFlags::ForceHierarchical |
                                 LookupFlags::DisallowWildcardImport | LookupFlags::NoSelectors;

    if (syntax.targetInstances) {
        if (syntax.target->kind != SyntaxKind::IdentifierName)
            return;

        Token name = syntax.target->as<IdentifierNameSyntax>().identifier;
        auto targetDef =
            getDefinition(name.valueText(), scope, name.range(), diag::UnknownModule).definition;
        if (!targetDef)
            return;

        for (auto inst : syntax.targetInstances->targets) {
            LookupResult result;
            Lookup::name(*inst, context, flags, result);
            result.reportDiags(context);

            if (result.found) {
                if (checkValidTarget(*result.found, *inst)) {
                    if (&result.found->as<InstanceSymbol>().getDefinition() != targetDef) {
                        auto& diag = scope.addDiag(diag::WrongBindTargetDef, inst->sourceRange());
                        diag << result.found->name << targetDef->name;
                        diag << syntax.target->sourceRange();
                        diag.addNote(diag::NoteDeclarationHere, result.found->location);
                    }
                    resolvedBind.instTargets.push_back(result.found);
                }
            }
        }
    }
    else {
        LookupResult result;
        Lookup::name(*syntax.target, context, flags, result);

        if (result.found) {
            if (checkValidTarget(*result.found, *syntax.target))
                resolvedBind.instTargets.push_back(result.found);
        }
        else {
            // If we didn't find the name as an instance, try as a definition.
            if (syntax.target->kind == SyntaxKind::IdentifierName) {
                Token name = syntax.target->as<IdentifierNameSyntax>().identifier;
                auto def = getDefinition(name.valueText(), scope, name.range(), diag::UnknownModule)
                               .definition;
                if (!def)
                    return;

                if (def->kind == SymbolKind::Definition)
                    resolvedBind.defTarget = &def->as<DefinitionSymbol>();
            }
        }

        if (!resolvedBind.defTarget)
            result.reportDiags(context);
    }

    // Resolve the actual instantiation definition now, since it depends on the current
    // config mapping, not the mapping of the target scope(s).
    if (syntax.instantiation->kind == SyntaxKind::HierarchyInstantiation) {
        auto& his = syntax.instantiation->as<HierarchyInstantiationSyntax>();
        resolvedBind.instanceDef = tryGetDefinition(his.type.valueText(), scope);

        // If we did not directly resolve to a new config root, look for a config
        // in our parent scope. If there is one, pretend we've created a new
        // config root at the targeted bind instance, so that modules underneath
        // the bound instance get the correct config.
        if (!resolvedBind.instanceDef.configRoot) {
            if (auto inst = scope.getContainingInstance(); inst && inst->parentInstance)
                resolvedBind.resolvedConfig = inst->parentInstance->resolvedConfig;
        }
    }
}